

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O0

NaReal __thiscall NaVector::metric(NaVector *this)

{
  uint uVar1;
  long *in_RDI;
  double dVar2;
  NaReal vMetric;
  uint i;
  double local_18;
  uint local_c;
  
  local_18 = 0.0;
  local_c = 0;
  while( true ) {
    uVar1 = (**(code **)(*in_RDI + 0x30))();
    if (uVar1 <= local_c) break;
    local_18 = *(double *)(in_RDI[2] + (ulong)local_c * 8) *
               *(double *)(in_RDI[2] + (ulong)local_c * 8) + local_18;
    local_c = local_c + 1;
  }
  dVar2 = sqrt(local_18);
  return dVar2;
}

Assistant:

NaReal
NaVector::metric () const
{
    unsigned    i;
    NaReal      vMetric = 0.0;
    for(i = 0; i < dim(); ++i)
        vMetric += pVect[i] * pVect[i];
    return sqrt(vMetric);
}